

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

bool __thiscall Js::AsmJsModuleCompiler::Init(AsmJsModuleCompiler *this)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  AsmJsMathFunction *pAVar4;
  AsmJsMathFunction *this_00;
  AsmJsMathFunction *this_01;
  AsmJsMathFunction *pAVar5;
  AsmJsTypedArrayFunction *pAVar6;
  AsmJsTypedArrayFunction **ppAVar7;
  ulong uVar8;
  undefined8 uStack_3d0;
  PropertyId local_3c8 [2];
  AsmJsTypedArrayFunction *local_3c0;
  undefined4 local_3b8;
  AsmJsTypedArrayFunction *local_3b0;
  undefined4 local_3a8;
  AsmJsTypedArrayFunction *local_3a0;
  undefined4 local_398;
  AsmJsTypedArrayFunction *local_390;
  undefined4 local_388;
  AsmJsTypedArrayFunction *local_380;
  undefined4 local_378;
  AsmJsTypedArrayFunction *local_370;
  undefined4 local_368;
  AsmJsTypedArrayFunction *local_360;
  undefined4 local_358;
  AsmJsTypedArrayFunction *local_350;
  PropertyId aPStack_2a0 [2];
  undefined8 local_298;
  ConstMath constMath [10];
  undefined8 local_1f0 [37];
  AsmJsRetType local_c8;
  AsmJsRetType local_c4;
  AsmJsRetType local_c0;
  AsmJsRetType local_bc;
  AsmJsRetType local_b8;
  AsmJsRetType local_b4;
  AsmJsRetType local_b0;
  AsmJsRetType local_ac;
  AsmJsRetType local_a8;
  AsmJsRetType local_a4;
  AsmJsRetType local_a0;
  AsmJsRetType local_9c;
  AsmJsRetType local_98;
  AsmJsRetType local_94;
  AsmJsRetType local_90;
  AsmJsRetType local_8c;
  AsmJsRetType local_88;
  AsmJsRetType local_84;
  AsmJsRetType local_80;
  AsmJsRetType local_7c;
  AsmJsRetType local_78;
  AsmJsRetType local_74;
  AsmJsRetType local_70;
  AsmJsRetType local_6c;
  AsmJsRetType local_68;
  AsmJsRetType local_64;
  AsmJsRetType local_60;
  AsmJsRetType local_5c;
  AsmJsMathFunction *local_58;
  AsmJsMathFunction *local_50;
  AsmJsMathFunction *local_48;
  AsmJsMathFunction *local_40;
  AsmJsMathFunction *local_38;
  
  if ((this->field_0x2e4 & 8) != 0) {
    return false;
  }
  this->field_0x2e4 = this->field_0x2e4 | 8;
  lVar3 = 8;
  do {
    *(undefined4 *)((long)&constMath[9].id + lVar3) = 0;
    *(undefined8 *)((long)&constMath[9].val + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x138);
  uStack_3d0 = 0x873176;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87318f;
  AsmJsRetType::AsmJsRetType(&local_c8,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sin,Sin_Db,local_c8);
  constMath[9].val._0_4_ = 0x2f;
  uStack_3d0 = 0x8731db;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8731f0;
  AsmJsRetType::AsmJsRetType(&local_c4,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_cos,Cos_Db,local_c4);
  uStack_3d0 = 0x87323f;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873258;
  AsmJsRetType::AsmJsRetType(&local_c0,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_tan,Tan_Db,local_c0);
  uStack_3d0 = 0x8732ab;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8732c0;
  AsmJsRetType::AsmJsRetType(&local_bc,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_asin,Asin_Db,local_bc);
  uStack_3d0 = 0x873311;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87332a;
  AsmJsRetType::AsmJsRetType(&local_b8,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_acos,Acos_Db,local_b8);
  uStack_3d0 = 0x873377;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87338c;
  AsmJsRetType::AsmJsRetType(&local_b4,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_atan,Atan_Db,local_b4);
  uStack_3d0 = 0x8733e0;
  this_00 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8733f5;
  AsmJsRetType::AsmJsRetType(&local_b0,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (this_00,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_ceil,Ceil_Db,local_b0);
  uStack_3d0 = 0x873442;
  this_01 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873457;
  AsmJsRetType::AsmJsRetType(&local_ac,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (this_01,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_floor,Floor_Db,local_ac)
  ;
  uStack_3d0 = 0x8734a4;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8734b9;
  AsmJsRetType::AsmJsRetType(&local_a8,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_exp,Exp_Db,local_a8);
  uStack_3d0 = 0x873506;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87351b;
  AsmJsRetType::AsmJsRetType(&local_a4,Double);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_log,Log_Db,local_a4);
  uStack_3d0 = 0x873568;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873581;
  AsmJsRetType::AsmJsRetType(&local_a0,Double);
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_pow,Pow_Db,local_a0,4,4);
  uStack_3d0 = 0x8735db;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8735f4;
  AsmJsRetType::AsmJsRetType(&local_9c,Double);
  uStack_3d0 = 4;
  local_58 = pAVar4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sqrt,Sqrt_Db,local_9c);
  uStack_3d0 = 0x87364b;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873660;
  AsmJsRetType::AsmJsRetType(&local_98,Double);
  uStack_3d0 = 4;
  local_38 = pAVar4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Db,local_98);
  uStack_3d0 = 0x8736b4;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8736c9;
  AsmJsRetType::AsmJsRetType(&local_94,Double);
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_atan2,Atan2_Db,local_94,4
             ,4);
  uStack_3d0 = 0x873727;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87373c;
  AsmJsRetType::AsmJsRetType(&local_90,Signed);
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_imul,Imul_Int,local_90,
             0xc,0xc);
  uStack_3d0 = 0x87378f;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8737a4;
  AsmJsRetType::AsmJsRetType(&local_8c,Float);
  uStack_3d0 = 7;
  local_50 = pAVar4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Flt,
             local_8c);
  uStack_3d0 = 0x8737f3;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873809;
  AsmJsRetType::AsmJsRetType(&local_88,Double);
  local_40 = pAVar4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_min,Min_Db,local_88,4,4);
  uStack_3d0 = 0x87386c;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87387e;
  AsmJsRetType::AsmJsRetType(&local_84,Double);
  local_48 = pAVar4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_max,Max_Db,local_84,4,4);
  uStack_3d0 = 0x8738d4;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8738e6;
  AsmJsRetType::AsmJsRetType(&local_80,Fixnum);
  uStack_3d0 = 0xc;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_clz32,Clz32_Int,local_80)
  ;
  uStack_3d0 = 0x87393b;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x87394d;
  AsmJsRetType::AsmJsRetType(&local_7c,Unsigned);
  uStack_3d0 = 10;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Int,local_7c);
  uStack_3d0 = 0x873982;
  AsmJsMathFunction::SetOverload(local_38,pAVar4);
  uStack_3d0 = 0x873999;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x8739ab;
  AsmJsRetType::AsmJsRetType(&local_78,Signed);
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_min,Min_Int,local_78,10,
             10);
  uStack_3d0 = 0x8739e5;
  AsmJsMathFunction::SetOverload(local_40,pAVar4);
  uStack_3d0 = 0x8739f5;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873a07;
  AsmJsRetType::AsmJsRetType(&local_74,Signed);
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_max,Max_Int,local_74,10,
             10);
  uStack_3d0 = 0x873a41;
  AsmJsMathFunction::SetOverload(local_48,pAVar4);
  uStack_3d0 = 0x873a51;
  pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873a63;
  AsmJsRetType::AsmJsRetType(&local_70,Float);
  uStack_3d0 = 4;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Db,local_70
            );
  pAVar4 = local_50;
  uStack_3d0 = 0x873a9b;
  AsmJsMathFunction::SetOverload(local_50,pAVar5);
  uStack_3d0 = 0x873ab3;
  pAVar5 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873ac5;
  AsmJsRetType::AsmJsRetType(&local_6c,Float);
  uStack_3d0 = 0;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Int,
             local_6c);
  uStack_3d0 = 0x873af5;
  AsmJsMathFunction::SetOverload(pAVar4,pAVar5);
  uStack_3d0 = 0x873b0c;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873b22;
  AsmJsRetType::AsmJsRetType(&local_68,Floatish);
  uStack_3d0 = 6;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Flt,local_68);
  uStack_3d0 = 0x873b57;
  AsmJsMathFunction::SetOverload(local_38,pAVar4);
  uStack_3d0 = 0x873b72;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873b84;
  AsmJsRetType::AsmJsRetType(&local_64,Floatish);
  uStack_3d0 = 6;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_ceil,Ceil_Flt,local_64);
  uStack_3d0 = 0x873bb5;
  AsmJsMathFunction::SetOverload(this_00,pAVar4);
  uStack_3d0 = 0x873bd0;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873be2;
  AsmJsRetType::AsmJsRetType(&local_60,Floatish);
  uStack_3d0 = 6;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_floor,Floor_Flt,local_60)
  ;
  uStack_3d0 = 0x873c1a;
  AsmJsMathFunction::SetOverload(this_01,pAVar4);
  uStack_3d0 = 0x873c2e;
  pAVar4 = (AsmJsMathFunction *)new<Memory::ArenaAllocator>(0x50,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873c40;
  AsmJsRetType::AsmJsRetType(&local_5c,Floatish);
  uStack_3d0 = 6;
  AsmJsMathFunction::AsmJsMathFunction
            (pAVar4,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sqrt,Sqrt_Flt,local_5c);
  uStack_3d0 = 0x873c75;
  AsmJsMathFunction::SetOverload(local_58,pAVar4);
  lVar3 = 8;
  while (lVar3 + 0x10 != 0x148) {
    pAVar4 = *(AsmJsMathFunction **)((long)&constMath[9].val + lVar3);
    uStack_3d0 = 0x873c9f;
    bVar2 = AddStandardLibraryMathName
                      (this,*(PropertyId *)((long)&constMath[9].id + lVar3),pAVar4,pAVar4->mBuiltIn)
    ;
    lVar3 = lVar3 + 0x10;
    if (!bVar2) {
      return false;
    }
  }
  local_298 = 0x1400000075;
  constMath[0]._0_8_ = &Math::E;
  constMath[0].val = (double *)0x15000000d3;
  constMath[1]._0_8_ = &Math::LN10;
  constMath[1].val = (double *)0x16000000d4;
  constMath[2]._0_8_ = &Math::LN2;
  constMath[2].val = (double *)0x1700000029;
  constMath[3]._0_8_ = &Math::LOG2E;
  constMath[3].val = (double *)0x1800000028;
  constMath[4]._0_8_ = &Math::LOG10E;
  constMath[4].val = (double *)0x190000002b;
  constMath[5]._0_8_ = &Math::PI;
  constMath[5].val = (double *)0x1a00000157;
  constMath[6]._0_8_ = &Math::SQRT1_2;
  constMath[6].val = (double *)0x1b00000158;
  constMath[7]._0_8_ = &Math::SQRT2;
  constMath[7].val = (double *)0x1c000000ba;
  constMath[8]._0_8_ = &NumberConstants::POSITIVE_INFINITY;
  constMath[8].val = (double *)0x1d00000105;
  constMath[9]._0_8_ = &NumberConstants::NaN;
  lVar3 = 8;
  while (lVar3 + 0x10 != 0xb8) {
    uStack_3d0 = 0x873e12;
    bVar2 = AddStandardLibraryMathName
                      (this,*(PropertyId *)((long)aPStack_2a0 + lVar3),
                       *(double **)((long)constMath + lVar3 + -8),
                       *(AsmJSMathBuiltinFunction *)((long)aPStack_2a0 + lVar3 + 4));
    lVar3 = lVar3 + 0x10;
    if (!bVar2) {
      return false;
    }
  }
  lVar3 = 8;
  do {
    *(undefined4 *)((long)local_3c8 + lVar3 + -8) = 0;
    *(undefined8 *)((long)local_3c8 + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x138);
  uStack_3d0 = 0x873e5a;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873e70;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Int8Array,TYPE_INT8);
  ppAVar7 = &local_3c0;
  local_3b8 = 0x1ad;
  uStack_3d0 = 0x873e93;
  local_3b0 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873ea9;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Uint8Array,TYPE_UINT8
            );
  local_3c8[0] = 0x1b0;
  uStack_3d0 = 0x873ec5;
  local_3c0 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873edc;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Int16Array,TYPE_INT16
            );
  local_398 = 0x1ae;
  uStack_3d0 = 0x873ef8;
  local_390 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873f0f;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Uint16Array,
             TYPE_UINT16);
  local_3a8 = 0x1b2;
  uStack_3d0 = 0x873f2e;
  local_3a0 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873f45;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Int32Array,TYPE_INT32
            );
  local_378 = 0x1af;
  uStack_3d0 = 0x873f61;
  local_370 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873f78;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Uint32Array,
             TYPE_UINT32);
  local_388 = 0x1b3;
  uStack_3d0 = 0x873f94;
  local_380 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873faa;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Float32Array,
             TYPE_FLOAT32);
  local_368 = 0x1b4;
  uStack_3d0 = 0x873fc6;
  local_360 = pAVar6;
  pAVar6 = (AsmJsTypedArrayFunction *)new<Memory::ArenaAllocator>(0x40,&this->mAllocator,0x35916e);
  uStack_3d0 = 0x873fdc;
  AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
            (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Float64Array,
             TYPE_FLOAT64);
  local_358 = 0x1b5;
  local_350 = pAVar6;
  uVar1 = 0;
  do {
    uVar8 = uVar1;
    if (uVar8 == 8) break;
    uStack_3d0 = 0x874004;
    bVar2 = AddStandardLibraryArrayName
                      (this,*(PropertyId *)(ppAVar7 + -1),*ppAVar7,(*ppAVar7)->mBuiltIn);
    ppAVar7 = ppAVar7 + 2;
    uVar1 = uVar8 + 1;
  } while (bVar2);
  return 7 < uVar8;
}

Assistant:

bool AsmJsModuleCompiler::Init()
    {
        if (mInitialised)
        {
            return false;
        }
        mInitialised = true;

        struct MathFunc
        {
            MathFunc(PropertyId id_ = 0, AsmJsMathFunction* val_ = nullptr) :
                id(id_), val(val_)
            {
            }
            PropertyId id;
            AsmJsMathFunction* val;
        };
        MathFunc mathFunctions[AsmJSMathBuiltinFunction_COUNT];
        // we could move the mathBuiltinFuncname to MathFunc struct
        mathFunctions[AsmJSMathBuiltin_sin] = MathFunc(PropertyIds::sin, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sin, OpCodeAsmJs::Sin_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_cos] = MathFunc(PropertyIds::cos, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_cos, OpCodeAsmJs::Cos_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_tan] = MathFunc(PropertyIds::tan, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_tan, OpCodeAsmJs::Tan_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_asin] = MathFunc(PropertyIds::asin, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_asin, OpCodeAsmJs::Asin_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_acos] = MathFunc(PropertyIds::acos, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_acos, OpCodeAsmJs::Acos_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_atan] = MathFunc(PropertyIds::atan, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_atan, OpCodeAsmJs::Atan_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_ceil] = MathFunc(PropertyIds::ceil, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_ceil, OpCodeAsmJs::Ceil_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_floor] = MathFunc(PropertyIds::floor, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_floor, OpCodeAsmJs::Floor_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_exp] = MathFunc(PropertyIds::exp, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_exp, OpCodeAsmJs::Exp_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_log] = MathFunc(PropertyIds::log, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_log, OpCodeAsmJs::Log_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_pow] = MathFunc(PropertyIds::pow, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_pow, OpCodeAsmJs::Pow_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_sqrt] = MathFunc(PropertyIds::sqrt, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sqrt, OpCodeAsmJs::Sqrt_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_abs] = MathFunc(PropertyIds::abs, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_atan2] = MathFunc(PropertyIds::atan2, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_atan2, OpCodeAsmJs::Atan2_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_imul] = MathFunc(PropertyIds::imul, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_imul, OpCodeAsmJs::Imul_Int, AsmJsRetType::Signed, AsmJsType::Intish, AsmJsType::Intish));
        mathFunctions[AsmJSMathBuiltin_fround] = MathFunc(PropertyIds::fround, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Flt, AsmJsRetType::Float, AsmJsType::Floatish));
        mathFunctions[AsmJSMathBuiltin_min] = MathFunc(PropertyIds::min, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_min, OpCodeAsmJs::Min_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_max] = MathFunc(PropertyIds::max, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_max, OpCodeAsmJs::Max_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_clz32] = MathFunc(PropertyIds::clz32, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_clz32, OpCodeAsmJs::Clz32_Int, AsmJsRetType::Fixnum, AsmJsType::Intish));

        mathFunctions[AsmJSMathBuiltin_abs].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Int, AsmJsRetType::Unsigned, AsmJsType::Signed));
        mathFunctions[AsmJSMathBuiltin_min].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_min, OpCodeAsmJs::Min_Int, AsmJsRetType::Signed, AsmJsType::Signed, AsmJsType::Signed));
        mathFunctions[AsmJSMathBuiltin_max].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_max, OpCodeAsmJs::Max_Int, AsmJsRetType::Signed, AsmJsType::Signed, AsmJsType::Signed));

        //Float Overloads
        mathFunctions[AsmJSMathBuiltin_fround].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Db, AsmJsRetType::Float, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_fround].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Int, AsmJsRetType::Float, AsmJsType::Int));// should we split this into signed and unsigned?
        mathFunctions[AsmJSMathBuiltin_abs].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_ceil].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_ceil, OpCodeAsmJs::Ceil_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_floor].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_floor, OpCodeAsmJs::Floor_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_sqrt].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sqrt, OpCodeAsmJs::Sqrt_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));

        for (int i = 0; i < AsmJSMathBuiltinFunction_COUNT; i++)
        {
            if (!AddStandardLibraryMathName((PropertyId)mathFunctions[i].id, mathFunctions[i].val, mathFunctions[i].val->GetMathBuiltInFunction()))
            {
                return false;
            }
        }

        struct ConstMath
        {
            ConstMath(PropertyId id_, const double* val_, AsmJSMathBuiltinFunction mathLibConstName_) :
                id(id_), val(val_), mathLibConstName(mathLibConstName_) { }
            PropertyId id;
            AsmJSMathBuiltinFunction mathLibConstName;
            const double* val;
        };
        ConstMath constMath[] = {
            ConstMath(PropertyIds::E       , &Math::E                           , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_e),
            ConstMath(PropertyIds::LN10     , &Math::LN10                        , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_ln10),
            ConstMath(PropertyIds::LN2      , &Math::LN2                         , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_ln2),
            ConstMath(PropertyIds::LOG2E    , &Math::LOG2E                       , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_log2e),
            ConstMath(PropertyIds::LOG10E   , &Math::LOG10E                      , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_log10e),
            ConstMath(PropertyIds::PI       , &Math::PI                          , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_pi),
            ConstMath(PropertyIds::SQRT1_2  , &Math::SQRT1_2                     , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_sqrt1_2),
            ConstMath(PropertyIds::SQRT2    , &Math::SQRT2                       , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_sqrt2),
            ConstMath(PropertyIds::Infinity , &NumberConstants::POSITIVE_INFINITY, AsmJSMathBuiltinFunction::AsmJSMathBuiltin_infinity),
            ConstMath(PropertyIds::NaN      , &NumberConstants::NaN              , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_nan),
        };
        const int size = sizeof(constMath) / sizeof(ConstMath);
        for (int i = 0; i < size; i++)
        {
            if (!AddStandardLibraryMathName(constMath[i].id, constMath[i].val, constMath[i].mathLibConstName))
            {
                return false;
            }
        }


        struct ArrayFunc
        {
            ArrayFunc(PropertyId id_ = 0, AsmJsTypedArrayFunction* val_ = nullptr) :
                id(id_), val(val_)
            {
            }
            PropertyId id;
            AsmJsTypedArrayFunction* val;
        };

        ArrayFunc arrayFunctions[AsmJSMathBuiltinFunction_COUNT];
        arrayFunctions[AsmJSTypedArrayBuiltin_Int8Array] = ArrayFunc(PropertyIds::Int8Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int8Array, ArrayBufferView::TYPE_INT8));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint8Array] = ArrayFunc(PropertyIds::Uint8Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint8Array, ArrayBufferView::TYPE_UINT8));
        arrayFunctions[AsmJSTypedArrayBuiltin_Int16Array] = ArrayFunc(PropertyIds::Int16Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int16Array, ArrayBufferView::TYPE_INT16));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint16Array] = ArrayFunc(PropertyIds::Uint16Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint16Array, ArrayBufferView::TYPE_UINT16));
        arrayFunctions[AsmJSTypedArrayBuiltin_Int32Array] = ArrayFunc(PropertyIds::Int32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int32Array, ArrayBufferView::TYPE_INT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint32Array] = ArrayFunc(PropertyIds::Uint32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint32Array, ArrayBufferView::TYPE_UINT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Float32Array] = ArrayFunc(PropertyIds::Float32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Float32Array, ArrayBufferView::TYPE_FLOAT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Float64Array] = ArrayFunc(PropertyIds::Float64Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Float64Array, ArrayBufferView::TYPE_FLOAT64));

        for (int i = 0; i < AsmJSTypedArrayBuiltin_COUNT; i++)
        {
            if (!AddStandardLibraryArrayName((PropertyId)arrayFunctions[i].id, arrayFunctions[i].val, arrayFunctions[i].val->GetArrayBuiltInFunction()))
            {
                return false;
            }
        }
        return true;
    }